

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.hpp
# Opt level: O2

flexfloat<(unsigned_char)__x02_,_(unsigned_char)___>
operator/(flexfloat<(unsigned_char)__x02_,_(unsigned_char)___> *a,
         flexfloat<(unsigned_char)__x02_,_(unsigned_char)___> *b)

{
  double *in_RDX;
  fp_t extraout_XMM0_Qa;
  flexfloat<(unsigned_char)__x02_,_(unsigned_char)___> fVar1;
  double local_10;
  
  local_10 = (b->v).value / *in_RDX;
  flexfloat<(unsigned_char)'\x02',_(unsigned_char)'/'>::flexfloat<double>(a,&local_10);
  fVar1.v._8_8_ = a;
  fVar1.v.value = extraout_XMM0_Qa;
  return (flexfloat<(unsigned_char)__x02_,_(unsigned_char)___>)fVar1.v;
}

Assistant:

INLINE flexfloat operator/(const flexfloat &a, const flexfloat &b)
    {
#ifdef FLEXFLOAT_STATS
        if(flexfloat_stats_enabled) {
            if(flexfloat_vectorization) vops_stats[make_precision(exp_bits, frac_bits)].div++;
            else ops_stats[make_precision(exp_bits, frac_bits)].div++;
        }
#endif
        return flexfloat(a.v.value / b.v.value);
    }